

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O1

void __thiscall de::anon_unknown_0::TestExitThread::run(TestExitThread *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  deUint32 dVar4;
  int iVar5;
  Random rnd;
  deRandom dStack_28;
  
  uVar3 = ((uint)this->m_numThreads >> 0x10 ^ this->m_numThreads ^ 0x3d) * 9;
  uVar1 = ((uint)this->m_threadNdx >> 0x10 ^ this->m_threadNdx ^ 0x3d) * 9;
  uVar2 = (this->m_waitMode >> 0x10 ^ this->m_waitMode ^ 0x3d) * 9;
  uVar3 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d ^
          (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d ^ (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  deRandom_init(&dStack_28,uVar3 >> 0xf ^ uVar3);
  iVar5 = 10000;
  do {
    dVar4 = deRandom_getUint32(&dStack_28);
    if (dVar4 * -0x49e8fba7 < 0x417875) {
      SpinBarrier::removeThread(this->m_barrier,this->m_waitMode);
      return;
    }
    SpinBarrier::sync(this->m_barrier);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void run (void)
	{
		const int	numIters	= 10000;
		de::Random	rnd			(deInt32Hash(m_numThreads) ^ deInt32Hash(m_threadNdx) ^ deInt32Hash((deInt32)m_waitMode));
		const int	invExitProb	= 1000;

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			if (rnd.getInt(0, invExitProb) == 0)
			{
				m_barrier.removeThread(m_waitMode);
				break;
			}
			else
				m_barrier.sync(m_waitMode);
		}
	}